

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::verifyLookupTextureData
          (SparseTexture2LookupTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  pointer puVar1;
  bool bVar2;
  GLenum GVar3;
  deUint32 err;
  ostream *poVar4;
  ulong uVar5;
  TestError *this_00;
  undefined4 in_register_0000000c;
  ulong uVar6;
  GLint x;
  ulong uVar7;
  int iVar8;
  SparseTexture2LookupTestCase *this_01;
  undefined1 *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  size_type __new_size;
  SparseTexture2LookupTestCase *pSVar14;
  int iVar15;
  GLint depth;
  GLenum local_620;
  GLuint verifyTexture;
  GLint height;
  GLint width;
  GLenum local_610;
  GLint local_60c;
  pointer local_608;
  undefined8 local_600;
  int local_5f8;
  int local_5f4;
  SparseTexture2LookupTestCase *local_5f0;
  GLuint *local_5e8;
  ulong local_5e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  string shader;
  ProgramSources sources;
  FunctionToken f;
  ShaderProgram program;
  TokenStringsExt s;
  
  local_600 = CONCAT44(in_register_0000000c,format);
  puVar9 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            field_0x88;
  local_5e8 = texture;
  poVar4 = std::operator<<((ostream *)puVar9,"Verify Lookup Texture Data [function: ");
  poVar4 = std::operator<<(poVar4,(string *)funcToken);
  poVar4 = std::operator<<(poVar4,", level: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,level);
  std::operator<<(poVar4,"] - ");
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0xab0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_610 = target;
  local_60c = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar3 = local_610;
  local_5f8 = width / 2;
  bVar13 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    if (local_610 == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __new_size = (size_type)(height * width * depth);
    local_5f0 = this;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar1 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_608 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    FunctionToken::FunctionToken(&f,funcToken);
    local_620 = 0x8c1a;
    if (GVar3 == 0x9100) {
      local_620 = 0xde1;
    }
    gl4cts::Texture::Generate(gl,&verifyTexture);
    pSVar14 = local_5f0;
    gl4cts::Texture::Bind(gl,verifyTexture,local_620);
    gl4cts::Texture::Storage(gl,local_620,1,0x8229,width,height,depth);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0xadc);
    bVar13 = true;
    uVar6 = 0;
    while ((int)uVar6 <
           (pSVar14->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
           mState.samples) {
      local_5e0 = uVar6;
      memset(local_608,0,__new_size);
      gl4cts::Texture::Bind(gl,verifyTexture,local_620);
      gl4cts::Texture::SubImage(gl,local_620,0,0,0,0,width,height,depth,0x1903,0x1401,local_608);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"Texture::SubImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0xae5);
      this_01 = (SparseTexture2LookupTestCase *)st2_compute_lookupVerify;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shader,st2_compute_lookupVerify,(allocator<char> *)&s);
      createLookupShaderTokens(&s,this_01,local_610,(GLint)local_600,local_60c,(GLint)local_5e0,&f);
      replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&shader);
      replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&shader);
      replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&shader);
      replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&shader);
      replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&shader);
      replaceToken("<LOD>",s.lod._M_dataplus._M_p,&shader);
      replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&shader);
      replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&shader);
      replaceToken("<ICOORD_TYPE>",s.iCoordType._M_dataplus._M_p,&shader);
      replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&shader);
      replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&shader);
      replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&shader);
      replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&shader);
      replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,&shader)
      ;
      replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&shader);
      replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&shader);
      replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&shader);
      replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&shader);
      replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&shader);
      replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&shader);
      replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&shader);
      replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&shader);
      replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&shader);
      replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&shader);
      replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&shader);
      de::toString<int>((string *)&sources,&width);
      replaceToken("<TEX_WIDTH>",
                   (GLchar *)
                   sources.sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&shader);
      std::__cxx11::string::~string((string *)&sources);
      de::toString<int>((string *)&sources,&height);
      replaceToken("<TEX_HEIGHT>",
                   (GLchar *)
                   sources.sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&shader);
      std::__cxx11::string::~string((string *)&sources);
      de::toString<int>((string *)&sources,&depth);
      replaceToken("<TEX_DEPTH>",
                   (GLchar *)
                   sources.sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&shader);
      std::__cxx11::string::~string((string *)&sources);
      memset(&sources,0,0xac);
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      sources._193_8_ = 0;
      glu::ComputeSource::ComputeSource((ComputeSource *)&program,&shader);
      glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
      std::__cxx11::string::~string
                ((string *)
                 &program.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      glu::ShaderProgram::ShaderProgram
                (&program,((pSVar14->super_SparseTexture2CommitmentTestCase).
                           super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                          m_renderCtx,&sources);
      if (program.m_program.m_info.linkOk == true) {
        (*gl->useProgram)(program.m_program.m_program);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glUseProgram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb13);
        (*gl->bindImageTexture)(1,verifyTexture,0,'\x01',0,0x88b9,0x8232);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb1c);
        (*gl->uniform1i)(1,1);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb1e);
        bVar2 = std::operator!=(&f.name,"sparseImageLoadARB");
        if (bVar2) {
          (*gl->activeTexture)(0x84c0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glActiveTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb24);
          (*gl->bindTexture)(local_610,*local_5e8);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glBindTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb26);
          (*gl->uniform1i)(2,0);
          err = (*gl->getError)();
          iVar8 = 0xb28;
        }
        else {
          (*gl->bindImageTexture)(0,*local_5e8,local_60c,'\0',0,35000,(GLenum)local_600);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb32);
          (*gl->uniform1i)(2,0);
          err = (*gl->getError)();
          iVar8 = 0xb34;
        }
        glu::checkError(err,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,iVar8);
        (*gl->uniform1i)(3,local_5f8);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb39);
        (*gl->dispatchCompute)(width,height,depth);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb3b);
        (*gl->memoryBarrier)(0xffffffff);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glMemoryBarrier",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb3d);
        gl4cts::Texture::Bind(gl,verifyTexture,local_620);
        gl4cts::Texture::GetData(gl,0,local_620,0x1903,0x1401,local_608);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xb41);
        uVar6 = 0;
        uVar10 = 0;
        if (0 < width) {
          uVar10 = (ulong)(uint)width;
        }
        uVar11 = 0;
        if (0 < height) {
          uVar11 = (ulong)(uint)height;
        }
        uVar5 = (ulong)(uint)depth;
        if (depth < 1) {
          uVar5 = uVar6;
        }
        local_5f4 = height * width;
        for (uVar12 = 0; pSVar14 = local_5f0, uVar12 != uVar5; uVar12 = uVar12 + 1) {
          iVar8 = (int)uVar6;
          iVar15 = 0;
          for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
            for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
              bVar13 = (bool)(bVar13 & puVar1[uVar7 + (long)iVar15 + (long)iVar8] ==
                                       local_608[uVar7 + (long)iVar15 + (long)iVar8]);
            }
            iVar15 = iVar15 + width;
          }
          uVar6 = (ulong)(uint)(iVar8 + local_5f4);
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)puVar9,
                                 "Compute shader compilation failed (lookup) for target: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_610);
        poVar4 = std::operator<<(poVar4,", format: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_600);
        poVar4 = std::operator<<(poVar4,", shaderInfoLog: ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        &((*program.m_shaders[5].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog);
        poVar4 = std::operator<<(poVar4,", programInfoLog: ");
        poVar4 = std::operator<<(poVar4,(string *)&program.m_program.m_info);
        poVar4 = std::operator<<(poVar4,", shaderSource: ");
        poVar4 = std::operator<<(poVar4,shader._M_dataplus._M_p);
        std::operator<<(poVar4," - ");
        bVar13 = false;
      }
      glu::ShaderProgram::~ShaderProgram(&program);
      glu::ProgramSources::~ProgramSources(&sources);
      TokenStringsExt::~TokenStringsExt(&s);
      std::__cxx11::string::~string((string *)&shader);
      uVar6 = (ulong)((int)local_5e0 + 1);
    }
    gl4cts::Texture::Delete(gl,&verifyTexture);
    FunctionToken::~FunctionToken(&f);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return bVar13;
}

Assistant:

bool SparseTexture2LookupTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
														   GLuint& texture, GLint level, FunctionToken& funcToken)
{
	mLog << "Verify Lookup Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (int sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 0, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_lookupVerify;

		// Adjust shader source to texture format
		TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

		replaceToken("<FUNCTION>", f.name.c_str(), shader);
		replaceToken("<ARGUMENTS>", f.arguments.c_str(), shader);

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), shader);
		replaceToken("<LOD>", s.lod.c_str(), shader);
		replaceToken("<LOD_DEF>", s.lodDef.c_str(), shader);
		replaceToken("<COORD_TYPE>", s.coordType.c_str(), shader);
		replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), shader);
		replaceToken("<COORD_DEF>", s.coordDef.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
		replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
		replaceToken("<EPSILON>", s.epsilon.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<REFZ_DEF>", s.refZDef.c_str(), shader);
		replaceToken("<POINT_COORD>", s.pointCoord.c_str(), shader);
		replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), shader);
		replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), shader);
		replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), shader);
		replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), shader);
		replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), shader);
		replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), shader);
		replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), shader);

		replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), shader);
		replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), shader);
		replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

			// Pass output image to shader
			gl.bindImageTexture(1, //unit
								verifyTexture,
								0,		 //level
								GL_TRUE, //layered
								0,		 //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

			// Pass input sampler/image to shader
			if (f.name != "sparseImageLoadARB")
			{
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");
				gl.uniform1i(2, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}
			else
			{
				gl.bindImageTexture(0, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(2, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}

			// Pass committed region width to shader
			gl.uniform1i(3, widthCommitted /* committed region width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint z = 0; z < depth; ++z)
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width + z * width * height;
						GLubyte* outDataRegion = out_data + x + y * width + z * width * height;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (lookup) for target: " << target << ", format: " << format
				 << ", shaderInfoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", programInfoLog: " << program.getProgramInfo().infoLog << ", shaderSource: " << shader.c_str()
				 << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}